

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNamePrinter.h
# Opt level: O3

void __thiscall psy::C::SyntaxNamePrinter::~SyntaxNamePrinter(SyntaxNamePrinter *this)

{
  void *pvVar1;
  
  pvVar1 = *(void **)(this + 0x10);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)(this + 0x20) - (long)pvVar1);
  }
  psy::C::SyntaxVisitor::~SyntaxVisitor((SyntaxVisitor *)this);
  return;
}

Assistant:

class PSY_C_API SyntaxNamePrinter final : public SyntaxDumper
{
public:
    using SyntaxDumper::SyntaxDumper;

    enum class Style : char
    {
        Plain,
        Decorated
    };

    void print(const SyntaxNode* node, Style style);
    void print(const SyntaxNode* node, Style style, std::ostream& os);

private:
    virtual void nonterminal(const SyntaxNode* node) override;

    std::vector<std::tuple<const SyntaxNode*, int>> dump_;
}